

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O1

void Cmd_setslot(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined8 *puVar1;
  FWeaponSlot *pFVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  _func_int **in_RAX;
  char *pcVar6;
  undefined8 uVar7;
  PClass *p;
  PClassWeapon *type;
  FString config;
  int local_28;
  undefined4 uStack_24;
  
  _local_28 = (char *)in_RAX;
  iVar3 = FCommandLine::argc(argv);
  if (1 < iVar3) {
    pcVar6 = FCommandLine::operator[](argv,1);
    uVar4 = atoi(pcVar6);
    if ((int)uVar4 < 10) {
      if (ParsingKeyConf == true) {
        FString::FString((FString *)&stack0xffffffffffffffd8,argv->cmd);
        TArray<FString,_FString>::Grow(&KeyConfWeapons,1);
        FString::AttachToOther
                  (KeyConfWeapons.Array + KeyConfWeapons.Count,(FString *)&stack0xffffffffffffffd8);
        KeyConfWeapons.Count = KeyConfWeapons.Count + 1;
        FString::~FString((FString *)&stack0xffffffffffffffd8);
        return;
      }
      if (PlayingKeyConf != (FWeaponSlots *)0x0) {
        if (PlayingKeyConf->Slots[(int)uVar4].Weapons.Count != 0) {
          PlayingKeyConf->Slots[(int)uVar4].Weapons.Count = 0;
        }
        iVar3 = FCommandLine::argc(argv);
        if (iVar3 < 3) {
          return;
        }
        iVar3 = 2;
        do {
          pFVar2 = PlayingKeyConf->Slots;
          pcVar6 = FCommandLine::operator[](argv,iVar3);
          FWeaponSlot::AddWeapon(pFVar2 + (int)uVar4,pcVar6);
          iVar3 = iVar3 + 1;
          iVar5 = FCommandLine::argc(argv);
        } while (iVar3 < iVar5);
        return;
      }
      iVar3 = FCommandLine::argc(argv);
      if (iVar3 == 2) {
        Printf("Slot %d cleared\n",(ulong)uVar4);
      }
      Net_WriteByte('9');
      Net_WriteByte((BYTE)uVar4);
      iVar3 = FCommandLine::argc(argv);
      Net_WriteByte((char)iVar3 + 0xfe);
      iVar3 = FCommandLine::argc(argv);
      if (iVar3 < 3) {
        return;
      }
      iVar3 = 2;
      do {
        pcVar6 = FCommandLine::operator[](argv,iVar3);
        iVar5 = FName::NameManager::FindName(&FName::NameData,pcVar6,true);
        local_28 = iVar5;
        p = PClass::FindClass((FName *)&stack0xffffffffffffffd8);
        type = dyn_cast<PClassWeapon>((DObject *)p);
        Net_WriteWeapon(type);
        iVar3 = iVar3 + 1;
        iVar5 = FCommandLine::argc(argv);
      } while (iVar3 < iVar5);
      return;
    }
  }
  Printf("Usage: setslot [slot] [weapons]\nCurrent slot assignments:\n");
  if ((&players)[(long)consoleplayer * 0x54] != 0) {
    FGameConfigFile::GetConfigPath((FGameConfigFile *)&stack0xffffffffffffffd8,SUB81(GameConfig,0));
    Printf("\x1cHAdd the following to \x1cI%s\x1cH to retain these bindings:\n\x1c-[",_local_28);
    if (*(int *)(WeaponSection.Chars + -0xc) != 0) {
      Printf("%s.");
    }
    puVar1 = (undefined8 *)(&players)[(long)consoleplayer * 0x54];
    if (puVar1[1] == 0) {
      uVar7 = (**(code **)*puVar1)(puVar1);
      puVar1[1] = uVar7;
    }
    Printf("%s.Weapons]\n",FName::NameData.NameArray[*(int *)(puVar1[1] + 0xa0)].Text);
    FString::~FString((FString *)&stack0xffffffffffffffd8);
  }
  FWeaponSlots::PrintSettings((FWeaponSlots *)((long)consoleplayer * 0x2a0 + 0x17e6030));
  return;
}

Assistant:

CCMD (setslot)
{
	int slot;

	if (argv.argc() < 2 || (slot = atoi (argv[1])) >= NUM_WEAPON_SLOTS)
	{
		Printf("Usage: setslot [slot] [weapons]\nCurrent slot assignments:\n");
		if (players[consoleplayer].mo != NULL)
		{
			FString config(GameConfig->GetConfigPath(false));
			Printf(TEXTCOLOR_BLUE "Add the following to " TEXTCOLOR_ORANGE "%s" TEXTCOLOR_BLUE
				" to retain these bindings:\n" TEXTCOLOR_NORMAL "[", config.GetChars());
			if (WeaponSection.IsNotEmpty())
			{
				Printf("%s.", WeaponSection.GetChars());
			}
			Printf("%s.Weapons]\n", players[consoleplayer].mo->GetClass()->TypeName.GetChars());
		}
		players[consoleplayer].weapons.PrintSettings();
		return;
	}

	if (ParsingKeyConf)
	{
		KeyConfWeapons.Push(argv.args());
	}
	else if (PlayingKeyConf != NULL)
	{
		PlayingKeyConf->Slots[slot].Clear();
		for (int i = 2; i < argv.argc(); ++i)
		{
			PlayingKeyConf->Slots[slot].AddWeapon(argv[i]);
		}
	}
	else
	{
		if (argv.argc() == 2)
		{
			Printf ("Slot %d cleared\n", slot);
		}

		Net_WriteByte(DEM_SETSLOT);
		Net_WriteByte(slot);
		Net_WriteByte(argv.argc()-2);
		for (int i = 2; i < argv.argc(); i++)
		{
			Net_WriteWeapon(dyn_cast<PClassWeapon>(PClass::FindClass(argv[i])));
		}
	}
}